

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  uchar uVar1;
  byte bVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  cJSON *pcVar7;
  int iVar8;
  cJSON_bool cVar9;
  lconv *plVar10;
  long lVar11;
  ulong uVar12;
  cJSON *item_00;
  cJSON_bool cVar13;
  byte bVar14;
  uint uVar15;
  cJSON *item_01;
  cJSON *pcVar16;
  long in_FS_OFFSET;
  double dVar17;
  uchar *after_end;
  byte *local_80;
  byte local_78 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar13 = 0;
  cVar9 = 0;
  if ((input_buffer != (parse_buffer *)0x0) &&
     (puVar3 = input_buffer->content, cVar9 = cVar13, puVar3 != (uchar *)0x0)) {
    uVar4 = input_buffer->length;
    uVar5 = input_buffer->offset;
    uVar12 = uVar5 + 4;
    if ((uVar4 < uVar12) || (iVar8 = strncmp((char *)(puVar3 + uVar5),"null",4), iVar8 != 0)) {
      if ((uVar4 < uVar5 + 5) || (iVar8 = strncmp((char *)(puVar3 + uVar5),"false",5), iVar8 != 0))
      {
        if ((uVar4 < uVar12) || (iVar8 = strncmp((char *)(puVar3 + uVar5),"true",4), iVar8 != 0)) {
          if (uVar5 < uVar4) {
            uVar1 = puVar3[uVar5];
            if (uVar1 == '\"') {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                cVar9 = parse_string(item,input_buffer);
                return cVar9;
              }
              goto LAB_00103a8b;
            }
            if (uVar1 == '-' || (byte)(uVar1 - 0x30) < 10) {
              local_80 = (byte *)0x0;
              plVar10 = localeconv();
              puVar3 = input_buffer->content;
              if (puVar3 != (uchar *)0x0) {
                bVar2 = *plVar10->decimal_point;
                uVar12 = input_buffer->length;
                sVar6 = input_buffer->offset;
                lVar11 = 0;
                do {
                  if ((uVar12 <= sVar6 + lVar11) ||
                     ((bVar14 = puVar3[lVar11 + sVar6], 9 < bVar14 - 0x30 &&
                      ((uVar15 = bVar14 - 0x2b, 0x3a < uVar15 ||
                       (((0x400000004000005U >> ((ulong)uVar15 & 0x3f) & 1) == 0 &&
                        (bVar14 = bVar2, (ulong)uVar15 != 3)))))))) goto LAB_0010395d;
                  local_78[lVar11] = bVar14;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 0x3f);
                lVar11 = 0x3f;
LAB_0010395d:
                local_78[lVar11] = 0;
                dVar17 = strtod((char *)local_78,(char **)&local_80);
                if (local_78 != local_80) {
                  item->valuedouble = dVar17;
                  iVar8 = 0x7fffffff;
                  if ((dVar17 < 2147483647.0) && (iVar8 = -0x80000000, -2147483648.0 < dVar17)) {
                    iVar8 = (int)dVar17;
                  }
                  item->valueint = iVar8;
                  item->type = 8;
                  input_buffer->offset =
                       (size_t)(local_80 + (input_buffer->offset - (long)local_78));
                  goto LAB_0010388e;
                }
              }
LAB_00103a7d:
              cVar9 = 0;
            }
            else {
              if (uVar1 == '{') {
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  cVar9 = parse_object(item,input_buffer);
                  return cVar9;
                }
                goto LAB_00103a8b;
              }
              if (((uVar1 == '[') && (input_buffer->depth < 1000)) &&
                 (input_buffer->depth = input_buffer->depth + 1, puVar3[uVar5] == '[')) {
                input_buffer->offset = uVar5 + 1;
                buffer_skip_whitespace(input_buffer);
                uVar12 = input_buffer->offset;
                if (uVar12 < input_buffer->length) {
                  if (input_buffer->content[uVar12] == ']') {
                    input_buffer->depth = input_buffer->depth - 1;
                    item_01 = (cJSON *)0x0;
                  }
                  else {
                    input_buffer->offset = uVar12 - 1;
                    item_01 = (cJSON *)0x0;
                    pcVar16 = (cJSON *)0x0;
                    do {
                      item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
                      if (item_00 == (cJSON *)0x0) {
                        if (item_01 == (cJSON *)0x0) goto LAB_00103a7d;
                        goto LAB_00103a75;
                      }
                      item_00->valuedouble = 0.0;
                      item_00->string = (char *)0x0;
                      item_00->valuestring = (char *)0x0;
                      *(undefined8 *)&item_00->valueint = 0;
                      item_00->child = (cJSON *)0x0;
                      *(undefined8 *)&item_00->type = 0;
                      item_00->next = (cJSON *)0x0;
                      item_00->prev = (cJSON *)0x0;
                      pcVar7 = item_00;
                      if (item_01 != (cJSON *)0x0) {
                        pcVar16->next = item_00;
                        item_00->prev = pcVar16;
                        pcVar7 = item_01;
                      }
                      item_01 = pcVar7;
                      input_buffer->offset = input_buffer->offset + 1;
                      buffer_skip_whitespace(input_buffer);
                      cVar9 = parse_value(item_00,input_buffer);
                      if (cVar9 == 0) goto LAB_00103a75;
                      buffer_skip_whitespace(input_buffer);
                      uVar12 = input_buffer->offset;
                      if (input_buffer->length <= uVar12) goto LAB_00103a75;
                      pcVar16 = item_00;
                    } while (input_buffer->content[uVar12] == ',');
                    if (input_buffer->content[uVar12] != ']') {
LAB_00103a75:
                      cJSON_Delete(item_01);
                      goto LAB_00103a7d;
                    }
                    input_buffer->depth = input_buffer->depth - 1;
                    item_01->prev = item_00;
                  }
                  item->type = 0x20;
                  item->child = item_01;
                  input_buffer->offset = uVar12 + 1;
                  goto LAB_0010388e;
                }
                input_buffer->offset = uVar12 - 1;
              }
            }
          }
          goto LAB_00103893;
        }
        item->type = 2;
        item->valueint = 1;
        input_buffer->offset = uVar12;
      }
      else {
        item->type = 1;
        input_buffer->offset = uVar5 + 5;
      }
    }
    else {
      item->type = 4;
      input_buffer->offset = uVar12;
    }
LAB_0010388e:
    cVar9 = 1;
  }
LAB_00103893:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar9;
  }
LAB_00103a8b:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }

    return false;
}